

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O0

void Eigen::internal::general_matrix_vector_product<long,_double,_0,_false,_double,_false,_0>::run
               (long rows,long cols,double *lhs,long lhsStride,double *rhs,long rhsIncr,
               ResScalar *res,long resIncr,double alpha)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  double *pdVar4;
  double dVar5;
  Packet2d adVar6;
  double adVar7 [2];
  uint local_6cc;
  double local_6c8;
  long local_6c0;
  long i_3;
  double local_6a8 [2];
  double local_698 [3];
  long local_680;
  long i_2;
  double local_668 [2];
  double local_658 [3];
  long local_640;
  long i_1;
  long local_630;
  long j_6;
  double *lhs0_1;
  double dStack_618;
  RhsPacket ptmp0_1;
  long k;
  long start;
  long end;
  double local_5e8;
  double local_5e0;
  double local_5d8;
  long local_5d0;
  long j_5;
  double local_5b8 [2];
  double local_5a8 [2];
  double local_598 [2];
  double local_588 [2];
  double local_578 [2];
  double local_568 [2];
  double local_558 [2];
  double local_548 [2];
  double local_538 [2];
  double local_528 [2];
  double local_518 [2];
  double local_508 [3];
  long local_4f0;
  long j_4;
  double local_4d8 [2];
  double local_4c8 [2];
  double local_4b8 [2];
  double local_4a8 [2];
  double local_498 [2];
  double local_488 [2];
  double local_478 [2];
  double local_468 [2];
  double local_458 [2];
  double local_448 [2];
  double local_438 [2];
  double local_428 [2];
  double local_418 [2];
  double local_408 [2];
  double dStack_3f8;
  ResPacket T1;
  ResPacket T0;
  LhsPacket A13;
  LhsPacket A12;
  LhsPacket A11;
  LhsPacket A10;
  LhsPacket A03;
  LhsPacket A02;
  LhsPacket A01;
  LhsPacket A00;
  long local_350;
  long j_3;
  double local_338 [2];
  double local_328 [2];
  double local_318 [2];
  double local_308 [2];
  double local_2f8 [2];
  double local_2e8 [2];
  double local_2d8 [2];
  double local_2c8 [2];
  double local_2b8 [2];
  double local_2a8 [2];
  double local_298 [2];
  double local_288 [3];
  long local_270;
  long j_2;
  double local_258 [2];
  double local_248 [2];
  double local_238 [2];
  double local_228 [2];
  double local_218 [2];
  double local_208 [2];
  double local_1f8 [2];
  double local_1e8 [2];
  double local_1d8 [2];
  double local_1c8 [2];
  double local_1b8 [2];
  double local_1a8 [3];
  long local_190;
  long j_1;
  double local_180;
  double local_178;
  double local_170;
  long local_168;
  long j;
  double *lhs3;
  double *lhs2;
  double *lhs1;
  double *lhs0;
  double dStack_138;
  RhsPacket ptmp3;
  double local_120;
  double dStack_118;
  RhsPacket ptmp2;
  double local_100;
  double dStack_f8;
  RhsPacket ptmp1;
  double local_e0;
  double dStack_d8;
  RhsPacket ptmp0;
  long i;
  long columnBound;
  long offset3;
  long offset1;
  long skipColumns;
  long lhsAlignmentOffset;
  long alignmentPattern;
  long alignmentStep;
  long peeledSize;
  long alignedSize;
  long alignedStart;
  long size;
  long ResPacketAlignedMask;
  long LhsPacketAlignedMask;
  long peels;
  long columnsAtOnce;
  conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
  pcj;
  double dStack_40;
  conj_helper<double,_double,_false,_false> cj;
  double alpha_local;
  long rhsIncr_local;
  double *rhs_local;
  long lhsStride_local;
  double *lhs_local;
  long cols_local;
  long rows_local;
  
  dStack_40 = alpha;
  lhs_local = (double *)cols;
  cols_local = rows;
  ignore_unused_variable<long>(&resIncr);
  peels = 4;
  LhsPacketAlignedMask = 2;
  ResPacketAlignedMask = 1;
  size = 1;
  alignedStart = cols_local;
  alignedSize = first_aligned<double,long>(res,cols_local);
  peeledSize = alignedSize + (alignedStart - alignedSize & 0xfffffffffffffffeU);
  alignmentStep = peeledSize + -5;
  alignmentPattern = 2U - lhsStride % 2 & 1;
  if (alignmentPattern == 0) {
    local_6cc = 0;
  }
  else {
    local_6cc = 2;
    if (alignmentPattern == 1) {
      local_6cc = 1;
    }
  }
  lhsAlignmentOffset = (long)local_6cc;
  skipColumns = first_aligned<double,long>(lhs,alignedStart);
  offset1 = 0;
  if ((((ulong)lhs & 7) == 0) && (((ulong)res & 7) == 0)) {
    for (; offset1 < 2 && alignedSize != (skipColumns + alignmentPattern * offset1) % 2;
        offset1 = offset1 + 1) {
    }
    if (offset1 == 2) {
      lhsAlignmentOffset = 3;
      offset1 = 0;
    }
    else {
      plVar3 = std::min<long>(&offset1,(long *)&lhs_local);
      offset1 = *plVar3;
    }
  }
  else {
    peeledSize = 0;
    alignedSize = 0;
  }
  iVar1 = 1;
  if (alignmentPattern == 1) {
    iVar1 = 3;
  }
  iVar2 = 3;
  if (alignmentPattern == 1) {
    iVar2 = 1;
  }
  k = (((long)lhs_local - offset1) / 4) * 4 + offset1;
  for (ptmp0[1] = (double)offset1; (long)ptmp0[1] < k; ptmp0[1] = (double)((long)ptmp0[1] + 4)) {
    local_e0 = dStack_40 * rhs[(long)ptmp0[1] * rhsIncr];
    adVar6 = pset1<double__vector(2)>(&local_e0);
    dStack_d8 = adVar6[0];
    local_100 = dStack_40 * rhs[((long)ptmp0[1] + (long)iVar1) * rhsIncr];
    adVar6 = pset1<double__vector(2)>(&local_100);
    dStack_f8 = adVar6[0];
    local_120 = dStack_40 * rhs[((long)ptmp0[1] + 2) * rhsIncr];
    adVar6 = pset1<double__vector(2)>(&local_120);
    dStack_118 = adVar6[0];
    lhs0 = (double *)(dStack_40 * rhs[((long)ptmp0[1] + (long)iVar2) * rhsIncr]);
    adVar6 = pset1<double__vector(2)>((double *)&lhs0);
    dStack_138 = adVar6[0];
    lhs1 = lhs + (long)ptmp0[1] * lhsStride;
    lhs2 = lhs + ((long)ptmp0[1] + (long)iVar1) * lhsStride;
    lhs3 = lhs + ((long)ptmp0[1] + 2) * lhsStride;
    j = (long)(lhs + ((long)ptmp0[1] + (long)iVar2) * lhsStride);
    for (local_168 = 0; local_168 < alignedSize; local_168 = local_168 + 1) {
      pdVar4 = lhs1 + local_168;
      local_170 = pfirst<double__vector(2)>((Packet2d *)&dStack_d8);
      dVar5 = conj_helper<double,_double,_false,_false>::pmadd
                        ((conj_helper<double,_double,_false,_false> *)((long)&columnsAtOnce + 7),
                         pdVar4,&local_170,res + local_168);
      res[local_168] = dVar5;
      pdVar4 = lhs2 + local_168;
      local_178 = pfirst<double__vector(2)>((Packet2d *)&dStack_f8);
      dVar5 = conj_helper<double,_double,_false,_false>::pmadd
                        ((conj_helper<double,_double,_false,_false> *)((long)&columnsAtOnce + 7),
                         pdVar4,&local_178,res + local_168);
      res[local_168] = dVar5;
      pdVar4 = lhs3 + local_168;
      local_180 = pfirst<double__vector(2)>((Packet2d *)&dStack_118);
      dVar5 = conj_helper<double,_double,_false,_false>::pmadd
                        ((conj_helper<double,_double,_false,_false> *)((long)&columnsAtOnce + 7),
                         pdVar4,&local_180,res + local_168);
      res[local_168] = dVar5;
      pdVar4 = (double *)(j + local_168 * 8);
      j_1 = (long)pfirst<double__vector(2)>((Packet2d *)&dStack_138);
      dVar5 = conj_helper<double,_double,_false,_false>::pmadd
                        ((conj_helper<double,_double,_false,_false> *)((long)&columnsAtOnce + 7),
                         pdVar4,(double *)&j_1,res + local_168);
      res[local_168] = dVar5;
    }
    if (alignedSize < peeledSize) {
      if (lhsAlignmentOffset == 0) {
        for (local_190 = alignedSize; local_190 < peeledSize; local_190 = local_190 + 2) {
          pdVar4 = res + local_190;
          adVar6 = pload<double__vector(2)>(res + local_190);
          local_1b8[0] = adVar6[0];
          adVar6 = pload<double__vector(2)>(lhs1 + local_190);
          local_1f8[0] = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),&local_1f8,(double (*) [2])&dStack_d8);
          local_1e8[0] = adVar7[0];
          adVar6 = pload<double__vector(2)>(lhs2 + local_190);
          local_218[0] = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),&local_218,(double (*) [2])&dStack_f8);
          local_208[0] = adVar7[0];
          adVar6 = padd<double__vector(2)>(&local_1e8,&local_208);
          local_1d8[0] = adVar6[0];
          adVar6 = pload<double__vector(2)>(lhs3 + local_190);
          local_248[0] = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),&local_248,(double (*) [2])&dStack_118);
          local_238[0] = adVar7[0];
          adVar6 = pload<double__vector(2)>((double *)(j + local_190 * 8));
          j_2 = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),(double (*) [2])&j_2,
                          (double (*) [2])&dStack_138);
          local_258[0] = adVar7[0];
          adVar6 = padd<double__vector(2)>(&local_238,&local_258);
          local_228[0] = adVar6[0];
          adVar6 = padd<double__vector(2)>(&local_1d8,&local_228);
          local_1c8[0] = adVar6[0];
          adVar6 = padd<double__vector(2)>(&local_1b8,&local_1c8);
          local_1a8[0] = adVar6[0];
          pstore<double,double__vector(2)>(pdVar4,(Packet2d *)local_1a8);
        }
      }
      else if (lhsAlignmentOffset == 1) {
        for (local_270 = alignedSize; local_270 < peeledSize; local_270 = local_270 + 2) {
          pdVar4 = res + local_270;
          adVar6 = pload<double__vector(2)>(res + local_270);
          local_298[0] = adVar6[0];
          adVar6 = pload<double__vector(2)>(lhs1 + local_270);
          local_2d8[0] = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),&local_2d8,(double (*) [2])&dStack_d8);
          local_2c8[0] = adVar7[0];
          adVar6 = ploadu<double__vector(2)>(lhs2 + local_270);
          local_2f8[0] = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),&local_2f8,(double (*) [2])&dStack_f8);
          local_2e8[0] = adVar7[0];
          adVar6 = padd<double__vector(2)>(&local_2c8,&local_2e8);
          local_2b8[0] = adVar6[0];
          adVar6 = pload<double__vector(2)>(lhs3 + local_270);
          local_328[0] = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),&local_328,(double (*) [2])&dStack_118);
          local_318[0] = adVar7[0];
          adVar6 = ploadu<double__vector(2)>((double *)(j + local_270 * 8));
          j_3 = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),(double (*) [2])&j_3,
                          (double (*) [2])&dStack_138);
          local_338[0] = adVar7[0];
          adVar6 = padd<double__vector(2)>(&local_318,&local_338);
          local_308[0] = adVar6[0];
          adVar6 = padd<double__vector(2)>(&local_2b8,&local_308);
          local_2a8[0] = adVar6[0];
          adVar6 = padd<double__vector(2)>(&local_298,&local_2a8);
          local_288[0] = adVar6[0];
          pstore<double,double__vector(2)>(pdVar4,(Packet2d *)local_288);
        }
      }
      else if (lhsAlignmentOffset == 2) {
        local_350 = alignedSize;
        adVar6 = pload<double__vector(2)>(lhs2 + alignedSize + -1);
        A02[1] = adVar6[0];
        adVar6 = pload<double__vector(2)>(lhs3 + alignedSize + -2);
        A03[1] = adVar6[0];
        adVar6 = pload<double__vector(2)>((double *)(j + (alignedSize + -3) * 8));
        A10[1] = adVar6[0];
        for (; local_350 < alignmentStep; local_350 = local_350 + 4) {
          adVar6 = pload<double__vector(2)>(lhs2 + local_350 + 1);
          A12[1] = adVar6[0];
          palign<1,double__vector(2)>((double (*) [2])(A02 + 1),(double (*) [2])(A12 + 1));
          adVar6 = pload<double__vector(2)>(lhs3 + local_350);
          A13[1] = adVar6[0];
          palign<2,double__vector(2)>((double (*) [2])(A03 + 1),(double (*) [2])(A13 + 1));
          adVar6 = pload<double__vector(2)>((double *)(j + (local_350 + -1) * 8));
          T0[1] = adVar6[0];
          palign<3,double__vector(2)>((double (*) [2])(A10 + 1),(double (*) [2])(T0 + 1));
          adVar6 = pload<double__vector(2)>(lhs1 + local_350);
          A01[1] = adVar6[0];
          adVar6 = pload<double__vector(2)>(lhs1 + local_350 + 2);
          A11[1] = adVar6[0];
          adVar6 = pload<double__vector(2)>(res + local_350);
          local_408[0] = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&columnsAtOnce + 6),(double (*) [2])(A01 + 1),
                           (double (*) [2])&dStack_d8,&local_408);
          T1[1] = adVar7[0];
          adVar6 = pload<double__vector(2)>(res + local_350 + 2);
          local_418[0] = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&columnsAtOnce + 6),(double (*) [2])(A11 + 1),
                           (double (*) [2])&dStack_d8,&local_418);
          dStack_3f8 = adVar7[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&columnsAtOnce + 6),(double (*) [2])(A02 + 1),
                           (double (*) [2])&dStack_f8,(double (*) [2])(T1 + 1));
          T1[1] = adVar7[0];
          adVar6 = pload<double__vector(2)>(lhs2 + local_350 + 3);
          A02[1] = adVar6[0];
          palign<1,double__vector(2)>((double (*) [2])(A12 + 1),(double (*) [2])(A02 + 1));
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&columnsAtOnce + 6),(double (*) [2])(A03 + 1),
                           (double (*) [2])&dStack_118,(double (*) [2])(T1 + 1));
          T1[1] = adVar7[0];
          adVar6 = pload<double__vector(2)>(lhs3 + local_350 + 2);
          A03[1] = adVar6[0];
          palign<2,double__vector(2)>((double (*) [2])(A13 + 1),(double (*) [2])(A03 + 1));
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&columnsAtOnce + 6),(double (*) [2])(A10 + 1),
                           (double (*) [2])&dStack_138,(double (*) [2])(T1 + 1));
          T1[1] = adVar7[0];
          pstore<double,double__vector(2)>(res + local_350,(Packet2d *)(T1 + 1));
          adVar6 = pload<double__vector(2)>((double *)(j + (local_350 + 1) * 8));
          A10[1] = adVar6[0];
          palign<3,double__vector(2)>((double (*) [2])(T0 + 1),(double (*) [2])(A10 + 1));
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&columnsAtOnce + 6),(double (*) [2])(A12 + 1),
                           (double (*) [2])&dStack_f8,(double (*) [2])&dStack_3f8);
          dStack_3f8 = adVar7[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&columnsAtOnce + 6),(double (*) [2])(A13 + 1),
                           (double (*) [2])&dStack_118,(double (*) [2])&dStack_3f8);
          dStack_3f8 = adVar7[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&columnsAtOnce + 6),(double (*) [2])(T0 + 1),
                           (double (*) [2])&dStack_138,(double (*) [2])&dStack_3f8);
          dStack_3f8 = adVar7[0];
          pstore<double,double__vector(2)>(res + local_350 + 2,(Packet2d *)&dStack_3f8);
        }
        for (; local_350 < peeledSize; local_350 = local_350 + 2) {
          adVar6 = pload<double__vector(2)>(res + local_350);
          local_438[0] = adVar6[0];
          adVar6 = pload<double__vector(2)>(lhs1 + local_350);
          local_478[0] = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),&local_478,(double (*) [2])&dStack_d8);
          local_468[0] = adVar7[0];
          adVar6 = ploadu<double__vector(2)>(lhs2 + local_350);
          local_498[0] = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),&local_498,(double (*) [2])&dStack_f8);
          local_488[0] = adVar7[0];
          adVar6 = padd<double__vector(2)>(&local_468,&local_488);
          local_458[0] = adVar6[0];
          adVar6 = ploadu<double__vector(2)>(lhs3 + local_350);
          local_4c8[0] = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),&local_4c8,(double (*) [2])&dStack_118);
          local_4b8[0] = adVar7[0];
          adVar6 = ploadu<double__vector(2)>((double *)(j + local_350 * 8));
          j_4 = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),(double (*) [2])&j_4,
                          (double (*) [2])&dStack_138);
          local_4d8[0] = adVar7[0];
          adVar6 = padd<double__vector(2)>(&local_4b8,&local_4d8);
          local_4a8[0] = adVar6[0];
          adVar6 = padd<double__vector(2)>(&local_458,&local_4a8);
          local_448[0] = adVar6[0];
          adVar6 = padd<double__vector(2)>(&local_438,&local_448);
          local_428[0] = adVar6[0];
          pstore<double,double__vector(2)>(res + local_350,&local_428);
        }
      }
      else {
        for (local_4f0 = alignedSize; local_4f0 < peeledSize; local_4f0 = local_4f0 + 2) {
          pdVar4 = res + local_4f0;
          adVar6 = pload<double__vector(2)>(res + local_4f0);
          local_518[0] = adVar6[0];
          adVar6 = ploadu<double__vector(2)>(lhs1 + local_4f0);
          local_558[0] = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),&local_558,(double (*) [2])&dStack_d8);
          local_548[0] = adVar7[0];
          adVar6 = ploadu<double__vector(2)>(lhs2 + local_4f0);
          local_578[0] = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),&local_578,(double (*) [2])&dStack_f8);
          local_568[0] = adVar7[0];
          adVar6 = padd<double__vector(2)>(&local_548,&local_568);
          local_538[0] = adVar6[0];
          adVar6 = ploadu<double__vector(2)>(lhs3 + local_4f0);
          local_5a8[0] = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),&local_5a8,(double (*) [2])&dStack_118);
          local_598[0] = adVar7[0];
          adVar6 = ploadu<double__vector(2)>((double *)(j + local_4f0 * 8));
          j_5 = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmul((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                           *)((long)&columnsAtOnce + 6),(double (*) [2])&j_5,
                          (double (*) [2])&dStack_138);
          local_5b8[0] = adVar7[0];
          adVar6 = padd<double__vector(2)>(&local_598,&local_5b8);
          local_588[0] = adVar6[0];
          adVar6 = padd<double__vector(2)>(&local_538,&local_588);
          local_528[0] = adVar6[0];
          adVar6 = padd<double__vector(2)>(&local_518,&local_528);
          local_508[0] = adVar6[0];
          pstore<double,double__vector(2)>(pdVar4,(Packet2d *)local_508);
        }
      }
    }
    for (local_5d0 = peeledSize; local_5d0 < alignedStart; local_5d0 = local_5d0 + 1) {
      pdVar4 = lhs1 + local_5d0;
      local_5d8 = pfirst<double__vector(2)>((Packet2d *)&dStack_d8);
      dVar5 = conj_helper<double,_double,_false,_false>::pmadd
                        ((conj_helper<double,_double,_false,_false> *)((long)&columnsAtOnce + 7),
                         pdVar4,&local_5d8,res + local_5d0);
      res[local_5d0] = dVar5;
      pdVar4 = lhs2 + local_5d0;
      local_5e0 = pfirst<double__vector(2)>((Packet2d *)&dStack_f8);
      dVar5 = conj_helper<double,_double,_false,_false>::pmadd
                        ((conj_helper<double,_double,_false,_false> *)((long)&columnsAtOnce + 7),
                         pdVar4,&local_5e0,res + local_5d0);
      res[local_5d0] = dVar5;
      pdVar4 = lhs3 + local_5d0;
      local_5e8 = pfirst<double__vector(2)>((Packet2d *)&dStack_118);
      dVar5 = conj_helper<double,_double,_false,_false>::pmadd
                        ((conj_helper<double,_double,_false,_false> *)((long)&columnsAtOnce + 7),
                         pdVar4,&local_5e8,res + local_5d0);
      res[local_5d0] = dVar5;
      pdVar4 = (double *)(j + local_5d0 * 8);
      end = (long)pfirst<double__vector(2)>((Packet2d *)&dStack_138);
      dVar5 = conj_helper<double,_double,_false,_false>::pmadd
                        ((conj_helper<double,_double,_false,_false> *)((long)&columnsAtOnce + 7),
                         pdVar4,(double *)&end,res + local_5d0);
      res[local_5d0] = dVar5;
    }
  }
  start = (long)lhs_local;
  while( true ) {
    for (ptmp0_1[1] = (double)k; (long)ptmp0_1[1] < start;
        ptmp0_1[1] = (double)((long)ptmp0_1[1] + 1)) {
      lhs0_1 = (double *)(dStack_40 * rhs[(long)ptmp0_1[1] * rhsIncr]);
      adVar6 = pset1<double__vector(2)>((double *)&lhs0_1);
      dStack_618 = adVar6[0];
      j_6 = (long)(lhs + (long)ptmp0_1[1] * lhsStride);
      for (local_630 = 0; local_630 < alignedSize; local_630 = local_630 + 1) {
        pdVar4 = (double *)(j_6 + local_630 * 8);
        i_1 = (long)pfirst<double__vector(2)>((Packet2d *)&dStack_618);
        dVar5 = conj_helper<double,_double,_false,_false>::pmul
                          ((conj_helper<double,_double,_false,_false> *)((long)&columnsAtOnce + 7),
                           pdVar4,(double *)&i_1);
        res[local_630] = dVar5 + res[local_630];
      }
      if ((j_6 + alignedSize * 8 & 0xfU) == 0) {
        for (local_640 = alignedSize; local_640 < peeledSize; local_640 = local_640 + 2) {
          pdVar4 = res + local_640;
          adVar6 = pload<double__vector(2)>((double *)(j_6 + local_640 * 8));
          local_668[0] = adVar6[0];
          adVar6 = pload<double__vector(2)>(res + local_640);
          i_2 = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&columnsAtOnce + 6),&local_668,(double (*) [2])&dStack_618,
                           (double (*) [2])&i_2);
          local_658[0] = adVar7[0];
          pstore<double,double__vector(2)>(pdVar4,(Packet2d *)local_658);
        }
      }
      else {
        for (local_680 = alignedSize; local_680 < peeledSize; local_680 = local_680 + 2) {
          pdVar4 = res + local_680;
          adVar6 = ploadu<double__vector(2)>((double *)(j_6 + local_680 * 8));
          local_6a8[0] = adVar6[0];
          adVar6 = pload<double__vector(2)>(res + local_680);
          i_3 = adVar6[0];
          adVar7 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&columnsAtOnce + 6),&local_6a8,(double (*) [2])&dStack_618,
                           (double (*) [2])&i_3);
          local_698[0] = adVar7[0];
          pstore<double,double__vector(2)>(pdVar4,(Packet2d *)local_698);
        }
      }
      for (local_6c0 = peeledSize; local_6c0 < alignedStart; local_6c0 = local_6c0 + 1) {
        pdVar4 = (double *)(j_6 + local_6c0 * 8);
        local_6c8 = pfirst<double__vector(2)>((Packet2d *)&dStack_618);
        dVar5 = conj_helper<double,_double,_false,_false>::pmul
                          ((conj_helper<double,_double,_false,_false> *)((long)&columnsAtOnce + 7),
                           pdVar4,&local_6c8);
        res[local_6c0] = dVar5 + res[local_6c0];
      }
    }
    if (offset1 == 0) break;
    k = 0;
    start = offset1;
    offset1 = 0;
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,ColMajor,ConjugateLhs,RhsScalar,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsScalar* lhs, Index lhsStride,
  const RhsScalar* rhs, Index rhsIncr,
  ResScalar* res, Index resIncr, RhsScalar alpha)
{
  EIGEN_UNUSED_VARIABLE(resIncr)
  eigen_internal_assert(resIncr==1);
  #ifdef _EIGEN_ACCUMULATE_PACKETS
  #error _EIGEN_ACCUMULATE_PACKETS has already been defined
  #endif
  #define _EIGEN_ACCUMULATE_PACKETS(A0,A13,A2) \
    pstore(&res[j], \
      padd(pload<ResPacket>(&res[j]), \
        padd( \
          padd(pcj.pmul(EIGEN_CAT(ploa , A0)<LhsPacket>(&lhs0[j]),    ptmp0), \
                  pcj.pmul(EIGEN_CAT(ploa , A13)<LhsPacket>(&lhs1[j]),   ptmp1)), \
          padd(pcj.pmul(EIGEN_CAT(ploa , A2)<LhsPacket>(&lhs2[j]),    ptmp2), \
                  pcj.pmul(EIGEN_CAT(ploa , A13)<LhsPacket>(&lhs3[j]),   ptmp3)) )))

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  if(ConjugateRhs)
    alpha = numext::conj(alpha);

  enum { AllAligned = 0, EvenAligned, FirstAligned, NoneAligned };
  const Index columnsAtOnce = 4;
  const Index peels = 2;
  const Index LhsPacketAlignedMask = LhsPacketSize-1;
  const Index ResPacketAlignedMask = ResPacketSize-1;
//  const Index PeelAlignedMask = ResPacketSize*peels-1;
  const Index size = rows;
  
  // How many coeffs of the result do we have to skip to be aligned.
  // Here we assume data are at least aligned on the base scalar type.
  Index alignedStart = internal::first_aligned(res,size);
  Index alignedSize = ResPacketSize>1 ? alignedStart + ((size-alignedStart) & ~ResPacketAlignedMask) : 0;
  const Index peeledSize = alignedSize - RhsPacketSize*peels - RhsPacketSize + 1;

  const Index alignmentStep = LhsPacketSize>1 ? (LhsPacketSize - lhsStride % LhsPacketSize) & LhsPacketAlignedMask : 0;
  Index alignmentPattern = alignmentStep==0 ? AllAligned
                       : alignmentStep==(LhsPacketSize/2) ? EvenAligned
                       : FirstAligned;

  // we cannot assume the first element is aligned because of sub-matrices
  const Index lhsAlignmentOffset = internal::first_aligned(lhs,size);

  // find how many columns do we have to skip to be aligned with the result (if possible)
  Index skipColumns = 0;
  // if the data cannot be aligned (TODO add some compile time tests when possible, e.g. for floats)
  if( (size_t(lhs)%sizeof(LhsScalar)) || (size_t(res)%sizeof(ResScalar)) )
  {
    alignedSize = 0;
    alignedStart = 0;
  }
  else if (LhsPacketSize>1)
  {
    eigen_internal_assert(size_t(lhs+lhsAlignmentOffset)%sizeof(LhsPacket)==0 || size<LhsPacketSize);

    while (skipColumns<LhsPacketSize &&
          alignedStart != ((lhsAlignmentOffset + alignmentStep*skipColumns)%LhsPacketSize))
      ++skipColumns;
    if (skipColumns==LhsPacketSize)
    {
      // nothing can be aligned, no need to skip any column
      alignmentPattern = NoneAligned;
      skipColumns = 0;
    }
    else
    {
      skipColumns = (std::min)(skipColumns,cols);
      // note that the skiped columns are processed later.
    }

    eigen_internal_assert(  (alignmentPattern==NoneAligned)
                      || (skipColumns + columnsAtOnce >= cols)
                      || LhsPacketSize > size
                      || (size_t(lhs+alignedStart+lhsStride*skipColumns)%sizeof(LhsPacket))==0);
  }
  else if(Vectorizable)
  {
    alignedStart = 0;
    alignedSize = size;
    alignmentPattern = AllAligned;
  }

  Index offset1 = (FirstAligned && alignmentStep==1?3:1);
  Index offset3 = (FirstAligned && alignmentStep==1?1:3);

  Index columnBound = ((cols-skipColumns)/columnsAtOnce)*columnsAtOnce + skipColumns;
  for (Index i=skipColumns; i<columnBound; i+=columnsAtOnce)
  {
    RhsPacket ptmp0 = pset1<RhsPacket>(alpha*rhs[i*rhsIncr]),
              ptmp1 = pset1<RhsPacket>(alpha*rhs[(i+offset1)*rhsIncr]),
              ptmp2 = pset1<RhsPacket>(alpha*rhs[(i+2)*rhsIncr]),
              ptmp3 = pset1<RhsPacket>(alpha*rhs[(i+offset3)*rhsIncr]);

    // this helps a lot generating better binary code
    const LhsScalar *lhs0 = lhs + i*lhsStride,     *lhs1 = lhs + (i+offset1)*lhsStride,
                    *lhs2 = lhs + (i+2)*lhsStride, *lhs3 = lhs + (i+offset3)*lhsStride;

    if (Vectorizable)
    {
      /* explicit vectorization */
      // process initial unaligned coeffs
      for (Index j=0; j<alignedStart; ++j)
      {
        res[j] = cj.pmadd(lhs0[j], pfirst(ptmp0), res[j]);
        res[j] = cj.pmadd(lhs1[j], pfirst(ptmp1), res[j]);
        res[j] = cj.pmadd(lhs2[j], pfirst(ptmp2), res[j]);
        res[j] = cj.pmadd(lhs3[j], pfirst(ptmp3), res[j]);
      }

      if (alignedSize>alignedStart)
      {
        switch(alignmentPattern)
        {
          case AllAligned:
            for (Index j = alignedStart; j<alignedSize; j+=ResPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,d,d);
            break;
          case EvenAligned:
            for (Index j = alignedStart; j<alignedSize; j+=ResPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,du,d);
            break;
          case FirstAligned:
          {
            Index j = alignedStart;
            if(peels>1)
            {
              LhsPacket A00, A01, A02, A03, A10, A11, A12, A13;
              ResPacket T0, T1;

              A01 = pload<LhsPacket>(&lhs1[alignedStart-1]);
              A02 = pload<LhsPacket>(&lhs2[alignedStart-2]);
              A03 = pload<LhsPacket>(&lhs3[alignedStart-3]);

              for (; j<peeledSize; j+=peels*ResPacketSize)
              {
                A11 = pload<LhsPacket>(&lhs1[j-1+LhsPacketSize]);  palign<1>(A01,A11);
                A12 = pload<LhsPacket>(&lhs2[j-2+LhsPacketSize]);  palign<2>(A02,A12);
                A13 = pload<LhsPacket>(&lhs3[j-3+LhsPacketSize]);  palign<3>(A03,A13);

                A00 = pload<LhsPacket>(&lhs0[j]);
                A10 = pload<LhsPacket>(&lhs0[j+LhsPacketSize]);
                T0  = pcj.pmadd(A00, ptmp0, pload<ResPacket>(&res[j]));
                T1  = pcj.pmadd(A10, ptmp0, pload<ResPacket>(&res[j+ResPacketSize]));

                T0  = pcj.pmadd(A01, ptmp1, T0);
                A01 = pload<LhsPacket>(&lhs1[j-1+2*LhsPacketSize]);  palign<1>(A11,A01);
                T0  = pcj.pmadd(A02, ptmp2, T0);
                A02 = pload<LhsPacket>(&lhs2[j-2+2*LhsPacketSize]);  palign<2>(A12,A02);
                T0  = pcj.pmadd(A03, ptmp3, T0);
                pstore(&res[j],T0);
                A03 = pload<LhsPacket>(&lhs3[j-3+2*LhsPacketSize]);  palign<3>(A13,A03);
                T1  = pcj.pmadd(A11, ptmp1, T1);
                T1  = pcj.pmadd(A12, ptmp2, T1);
                T1  = pcj.pmadd(A13, ptmp3, T1);
                pstore(&res[j+ResPacketSize],T1);
              }
            }
            for (; j<alignedSize; j+=ResPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(d,du,du);
            break;
          }
          default:
            for (Index j = alignedStart; j<alignedSize; j+=ResPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(du,du,du);
            break;
        }
      }
    } // end explicit vectorization

    /* process remaining coeffs (or all if there is no explicit vectorization) */
    for (Index j=alignedSize; j<size; ++j)
    {
      res[j] = cj.pmadd(lhs0[j], pfirst(ptmp0), res[j]);
      res[j] = cj.pmadd(lhs1[j], pfirst(ptmp1), res[j]);
      res[j] = cj.pmadd(lhs2[j], pfirst(ptmp2), res[j]);
      res[j] = cj.pmadd(lhs3[j], pfirst(ptmp3), res[j]);
    }
  }

  // process remaining first and last columns (at most columnsAtOnce-1)
  Index end = cols;
  Index start = columnBound;
  do
  {
    for (Index k=start; k<end; ++k)
    {
      RhsPacket ptmp0 = pset1<RhsPacket>(alpha*rhs[k*rhsIncr]);
      const LhsScalar* lhs0 = lhs + k*lhsStride;

      if (Vectorizable)
      {
        /* explicit vectorization */
        // process first unaligned result's coeffs
        for (Index j=0; j<alignedStart; ++j)
          res[j] += cj.pmul(lhs0[j], pfirst(ptmp0));
        // process aligned result's coeffs
        if ((size_t(lhs0+alignedStart)%sizeof(LhsPacket))==0)
          for (Index i = alignedStart;i<alignedSize;i+=ResPacketSize)
            pstore(&res[i], pcj.pmadd(pload<LhsPacket>(&lhs0[i]), ptmp0, pload<ResPacket>(&res[i])));
        else
          for (Index i = alignedStart;i<alignedSize;i+=ResPacketSize)
            pstore(&res[i], pcj.pmadd(ploadu<LhsPacket>(&lhs0[i]), ptmp0, pload<ResPacket>(&res[i])));
      }

      // process remaining scalars (or all if no explicit vectorization)
      for (Index i=alignedSize; i<size; ++i)
        res[i] += cj.pmul(lhs0[i], pfirst(ptmp0));
    }
    if (skipColumns)
    {
      start = 0;
      end = skipColumns;
      skipColumns = 0;
    }
    else
      break;
  } while(Vectorizable);
  #undef _EIGEN_ACCUMULATE_PACKETS
}